

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::handleHeadersReceived
          (QHttp2ProtocolHandler *this,HttpHeader *headers,bool endStream)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  QHttpNetworkReply *reply;
  QHttpNetworkReplyPrivate *this_00;
  pointer pHVar5;
  char *pcVar6;
  storage_type *originalLength;
  QHttpNetworkRequestPrivate *pQVar7;
  undefined4 uVar8;
  bool bVar9;
  char cVar10;
  CutResult CVar11;
  QByteArray *data;
  QNonContiguousByteDevice *pQVar12;
  long lVar13;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_01;
  storage_type *psVar14;
  QArrayData *pQVar15;
  longlong lVar16;
  QMetaTypeInterface *pQVar17;
  int iVar18;
  ulong uVar19;
  HeaderField *pair;
  pointer lhs;
  QHttpNetworkRequest *this_02;
  long in_FS_OFFSET;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QHttp2Stream *stream;
  QString local_88;
  QHttp2Stream *local_70;
  undefined1 local_68 [16];
  QMetaMethodReturnArgument local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::sender();
  local_70 = (QHttp2Stream *)QMetaObject::cast((QObject *)&QHttp2Stream::staticMetaObject);
  QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  tryEmplace_impl<QHttp2Stream*const&>
            ((TryEmplaceResult *)&local_58,
             (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0x50)
             ,&local_70);
  lVar13 = ((ulong)local_58.name >> 7) * 0x90;
  lVar4 = *(long *)((local_58.metaType)->defaultCtr + lVar13 + 0x80);
  bVar3 = (byte)(local_58.metaType)->defaultCtr[(ulong)((uint)local_58.name & 0x7f) + lVar13];
  lVar13 = (ulong)bVar3 * 0x20;
  reply = *(QHttpNetworkReply **)(lVar4 + 0x18 + lVar13);
  this_00 = *(QHttpNetworkReplyPrivate **)&reply->field_0x8;
  lhs = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pHVar5 = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (lhs == pHVar5) {
    iVar18 = 0;
  }
  else {
    uVar19 = 0;
    do {
      pcVar6 = (lhs->value).d.ptr;
      originalLength = (storage_type *)(lhs->value).d.size;
      local_58.metaType = (QMetaTypeInterface *)0x2692a5;
      bVar9 = ::operator==(&lhs->name,(char **)&local_58);
      if (bVar9) {
        psVar14 = (storage_type *)0x3;
        if ((long)originalLength < 3) {
          psVar14 = originalLength;
        }
        local_58.data = &DAT_aaaaaaaaaaaaaaaa;
        local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.name = &DAT_aaaaaaaaaaaaaaaa;
        QVar20.m_data = psVar14;
        QVar20.m_size = (qsizetype)&local_58;
        QtPrivate::toSignedInteger(QVar20,(int)pcVar6);
        uVar19 = 0;
        if ((ulong)&local_58.metaType[0x1249249].metaObjectFn >> 0x20 == 0) {
          uVar19 = (ulong)local_58.metaType & 0xffffffff;
        }
        if (((ulong)local_58.name & 1) != 0) {
          uVar19 = 0;
        }
        QHttpNetworkReply::setStatusCode((QHttpNetworkReply *)reply,(int)uVar19);
        *(int *)(*(long *)(this + 0x18) + 0x54) = (int)uVar19;
        local_58.metaType = (QMetaTypeInterface *)&DAT_00000004;
        local_88.d.d = (Data *)0xffffffffffffffff;
        CVar11 = QtPrivate::QContainerImplHelper::mid
                           ((qsizetype)originalLength,(qsizetype *)&local_58,(qsizetype *)&local_88)
        ;
        pQVar15 = &(local_88.d.d)->super_QArrayData;
        if (CVar11 == Null) {
          pQVar15 = (QArrayData *)0x0;
        }
        QVar21.m_data = (storage_type *)pQVar15;
        QVar21.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar21);
        QHttpNetworkReply::setReasonPhrase((QHttpNetworkReply *)reply,(QString *)&local_58);
        if (local_58.metaType != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
          iVar1._0_2_ = (local_58.metaType)->revision;
          iVar1._2_2_ = (local_58.metaType)->alignment;
          UNLOCK();
          if (iVar1 == 0) {
            lVar16 = 2;
LAB_001f7adc:
            QArrayData::deallocate((QArrayData *)local_58.metaType,lVar16,0x10);
          }
        }
      }
      else {
        local_58.metaType = (QMetaTypeInterface *)0x26d735;
        bVar9 = ::operator==(&lhs->name,(char **)&local_58);
        if (bVar9) {
          QHttpNetworkReply::setMajorVersion((QHttpNetworkReply *)reply,pcVar6[5] + -0x30);
          QHttpNetworkReply::setMinorVersion((QHttpNetworkReply *)reply,pcVar6[7] + -0x30);
        }
        else {
          local_58.metaType = (QMetaTypeInterface *)0x2628b0;
          bVar9 = ::operator==(&lhs->name,(char **)&local_58);
          if (bVar9) {
            local_58.data = &DAT_aaaaaaaaaaaaaaaa;
            local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.name = &DAT_aaaaaaaaaaaaaaaa;
            QVar22.m_data = originalLength;
            QVar22.m_size = (qsizetype)&local_58;
            QtPrivate::toSignedInteger(QVar22,(int)pcVar6);
            if (((ulong)local_58.name & 1) == 0) {
              pQVar17 = local_58.metaType;
              if (((ulong)local_58.name & 1) != 0) {
                pQVar17 = (QMetaTypeInterface *)0x0;
              }
              (**(code **)(*(long *)reply + 0x88))(reply,pQVar17);
            }
          }
          else {
            local_58.metaType = (QMetaTypeInterface *)0x26290f;
            bVar9 = ::operator==(&lhs->name,(char **)&local_58);
            local_58.metaType = (QMetaTypeInterface *)(lhs->value).d.d;
            local_58.name = (lhs->value).d.ptr;
            local_58.data = (void *)(lhs->value).d.size;
            if (local_58.metaType != (QMetaTypeInterface *)0x0) {
              LOCK();
              *(int *)local_58.metaType = *(int *)local_58.metaType + 1;
              UNLOCK();
            }
            QVar24.m_data = (storage_type *)(2 - (ulong)bVar9);
            local_88.d.d = (Data *)((ulong)local_88.d.d & 0xffffffffffffff00);
            QVar23.m_data = (storage_type *)0x1;
            QVar23.m_size = (qsizetype)&local_58;
            QVar24.m_size = (qsizetype)&local_88;
            data = (QByteArray *)QByteArray::replace(QVar23,QVar24);
            QHttpNetworkReply::appendHeaderField((QHttpNetworkReply *)reply,&lhs->name,data);
            if (local_58.metaType != (QMetaTypeInterface *)0x0) {
              LOCK();
              *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
              iVar18._0_2_ = (local_58.metaType)->revision;
              iVar18._2_2_ = (local_58.metaType)->alignment;
              UNLOCK();
              if (iVar18 == 0) {
                lVar16 = 1;
                goto LAB_001f7adc;
              }
            }
          }
        }
      }
      iVar18 = (int)uVar19;
      lhs = lhs + 1;
    } while (lhs != pHVar5);
  }
  if (iVar18 - 0x66U < 0x62 || iVar18 == 100) {
    QHttpNetworkReplyPrivate::clearHttpLayerInformation(this_00);
  }
  else {
    this_02 = (QHttpNetworkRequest *)(lVar13 + lVar4 + 8);
    bVar9 = QHttpNetworkReply::isHttpRedirect(iVar18);
    if ((bVar9) && (bVar9 = QHttpNetworkRequest::isFollowRedirects(this_02), bVar9)) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QHttpNetworkConnectionPrivate::parseRedirectResponse
                ((QHttpNetworkConnectionPrivate *)local_68,reply);
      uVar8 = local_68._8_4_;
      if (local_68._8_4_ == NoError) {
        cVar10 = QUrl::isValid();
        if (cVar10 != '\0') {
          QHttpNetworkReply::setRedirectUrl((QHttpNetworkReply *)reply,(QUrl *)local_68);
        }
      }
      else {
        local_58.data = &DAT_aaaaaaaaaaaaaaaa;
        local_58.metaType = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.name = &DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_88.d.size = 0;
        QHttpNetworkConnectionPrivate::errorDetail
                  ((QString *)&local_58,
                   *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),local_68._8_4_,
                   *(QIODevice **)(this + 0x28),&local_88);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          }
        }
        finishStreamWithError(this,local_70,local_68._8_4_,(QString *)&local_58);
        QHttp2Stream::sendRST_STREAM((QHttp2Stream *)local_70,INTERNAL_ERROR);
        if (local_58.metaType != (QMetaTypeInterface *)0x0) {
          LOCK();
          *(int *)local_58.metaType = *(int *)local_58.metaType + -1;
          iVar2._0_2_ = (local_58.metaType)->revision;
          iVar2._2_2_ = (local_58.metaType)->alignment;
          UNLOCK();
          if (iVar2 == 0) {
            QArrayData::deallocate((QArrayData *)local_58.metaType,2,0x10);
          }
        }
      }
      QUrl::~QUrl((QUrl *)local_68);
      if (uVar8 != NoError) goto LAB_001f7e52;
    }
    bVar9 = QHttpNetworkReplyPrivate::isCompressed(this_00);
    if (bVar9) {
      this_01 = (QSharedDataPointer<QHttpNetworkRequestPrivate> *)
                ((ulong)bVar3 * 0x20 + lVar4 + 0x10);
      pQVar7 = (this_01->d).ptr;
      if ((pQVar7 != (QHttpNetworkRequestPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar7->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value !=
          (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_01);
      }
      if (((this_01->d).ptr)->autoDecompress == true) {
        QHttpNetworkReplyPrivate::removeAutoDecompressHeader(this_00);
      }
    }
    bVar9 = QHttpNetworkReply::isHttpRedirect(iVar18);
    if ((bVar9) &&
       (pQVar12 = QHttpNetworkRequest::uploadByteDevice(this_02),
       pQVar12 != (QNonContiguousByteDevice *)0x0)) {
      (**(code **)(*(long *)pQVar12 + 0x80))(pQVar12);
      this_00->totallyUploadedData = 0;
    }
    local_88.d.d = (Data *)QHttpNetworkReply::headerChanged;
    local_88.d.ptr = (char16_t *)0x0;
    local_58.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    local_58.name = (char *)0x0;
    local_58.data = (undefined1 *)0x0;
    QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
              (reply,(offset_in_QHttpNetworkReply_to_subr *)&local_88,QueuedConnection,&local_58);
    if (endStream) {
      finishStream(this,local_70,QueuedConnection);
    }
  }
LAB_001f7e52:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleHeadersReceived(const HPack::HttpHeader &headers, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &requestPair = requestReplyPairs[stream];
    auto *httpReply = requestPair.second;
    auto &httpRequest = requestPair.first;
    Q_ASSERT(httpReply || stream->state() == QHttp2Stream::State::ReservedRemote);

    auto *httpReplyPrivate = httpReply->d_func();

    // For HTTP/1 'location' is handled (and redirect URL set) when a protocol
    // handler emits channel->allDone(). Http/2 protocol handler never emits
    // allDone, since we have many requests multiplexed in one channel at any
    // moment and we are probably not done yet. So we extract url and set it
    // here, if needed.
    int statusCode = 0;
    for (const auto &pair : headers) {
        const auto &name = pair.name;
        const auto value = QByteArrayView(pair.value);

        // TODO: part of this code copies what SPDY protocol handler does when
        // processing headers. Binary nature of HTTP/2 and SPDY saves us a lot
        // of parsing and related errors/bugs, but it would be nice to have
        // more detailed validation of headers.
        if (name == ":status") {
            statusCode = value.left(3).toInt();
            httpReply->setStatusCode(statusCode);
            m_channel->lastStatus = statusCode; // Mostly useless for http/2, needed for auth
            httpReply->setReasonPhrase(QString::fromLatin1(value.mid(4)));
        } else if (name == ":version") {
            httpReply->setMajorVersion(value.at(5) - '0');
            httpReply->setMinorVersion(value.at(7) - '0');
        } else if (name == "content-length") {
            bool ok = false;
            const qlonglong length = value.toLongLong(&ok);
            if (ok)
                httpReply->setContentLength(length);
        } else {
            const auto binder = name == "set-cookie" ? QByteArrayView("\n") : QByteArrayView(", ");
            httpReply->appendHeaderField(name, QByteArray(pair.value).replace('\0', binder));
        }
    }

    // Discard all informational (1xx) replies with the exception of 101.
    // Also see RFC 9110 (Chapter 15.2)
    if (statusCode == 100 || (102 <= statusCode && statusCode <= 199)) {
        httpReplyPrivate->clearHttpLayerInformation();
        return;
    }

    if (QHttpNetworkReply::isHttpRedirect(statusCode) && httpRequest.isFollowRedirects()) {
        QHttpNetworkConnectionPrivate::ParseRedirectResult
                result = QHttpNetworkConnectionPrivate::parseRedirectResponse(httpReply);
        if (result.errorCode != QNetworkReply::NoError) {
            auto errorString = m_connection->d_func()->errorDetail(result.errorCode, m_socket);
            finishStreamWithError(stream, result.errorCode, errorString);
            stream->sendRST_STREAM(INTERNAL_ERROR);
            return;
        }

        if (result.redirectUrl.isValid())
            httpReply->setRedirectUrl(result.redirectUrl);
    }

    if (httpReplyPrivate->isCompressed() && httpRequest.d->autoDecompress)
        httpReplyPrivate->removeAutoDecompressHeader();

    if (QHttpNetworkReply::isHttpRedirect(statusCode)) {
        // Note: This status code can trigger uploadByteDevice->reset() in
        // QHttpNetworkConnectionChannel::handleStatus. Alas, we have no single
        // request/reply, we multiplex several requests and thus we never simply
        // call 'handleStatus'. If we have a byte-device - we try to reset it
        // here, we don't (and can't) handle any error during reset operation.
        if (auto *byteDevice = httpRequest.uploadByteDevice()) {
            byteDevice->reset();
            httpReplyPrivate->totallyUploadedData = 0;
        }
    }

    QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::headerChanged, Qt::QueuedConnection);
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}